

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status>,_kj::_::PromiseDisposer>
__thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status>,kj::_::PromiseDisposer,kj::HttpClient::ConnectRequest::Status>
          (PromiseDisposer *this,Status *params)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  ctor<kj::_::ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status>,kj::HttpClient::ConnectRequest::Status>
            ((ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status> *)((long)pvVar1 + 0x210),
             params);
  *(void **)((long)pvVar1 + 0x218) = pvVar1;
  *(ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status> **)this =
       (ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status> *)((long)pvVar1 + 0x210);
  return (Own<kj::_::ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status>,_kj::_::PromiseDisposer>
          )(ImmediatePromiseNode<kj::HttpClient::ConnectRequest::Status> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }